

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dirichlet_Laplacian_demo.cc
# Opt level: O0

vector<double,_std::allocator<double>_> *
SolveDirLaplSeqMesh<std::function<double(Eigen::Matrix<double,2,1,0,2,1>const&)>&,lf::mesh::utils::MeshFunctionGlobal<std::function<double(Eigen::Matrix<double,2,1,0,2,1>const&)>>>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          shared_ptr<lf::mesh::Mesh> *coarse_mesh_p,uint reflevels,
          function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)> *u,
          MeshFunctionGlobal<std::function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>_>
          *f)

{
  undefined1 local_148 [16];
  shared_ptr<const_lf::mesh::Mesh> local_138;
  __uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_128;
  uint local_11c;
  undefined1 local_115;
  uint level;
  uint local_110;
  size_type L;
  uint refstep;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_100;
  undefined1 local_f8 [8];
  MeshHierarchy multi_mesh;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_38;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  mesh_factory_ptr;
  MeshFunctionGlobal<std::function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>_> *f_local
  ;
  function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)> *u_local;
  uint reflevels_local;
  shared_ptr<lf::mesh::Mesh> *coarse_mesh_p_local;
  vector<double,_std::allocator<double>_> *errors;
  
  multi_mesh.refinement_edges_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  mesh_factory_ptr._M_t.
  super___uniq_ptr_impl<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  .super__Head_base<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_false>._M_head_impl =
       (__uniq_ptr_data<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>,_true,_true>
        )(__uniq_ptr_data<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>,_true,_true>
          )f;
  std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_38);
  std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
            ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
             &local_100,&local_38);
  lf::refinement::MeshHierarchy::MeshHierarchy((MeshHierarchy *)local_f8,coarse_mesh_p,&local_100);
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
            (&local_100);
  for (local_110 = 0; local_110 < reflevels; local_110 = local_110 + 1) {
    lf::refinement::MeshHierarchy::RefineRegular((MeshHierarchy *)local_f8,rp_regular);
  }
  level = lf::refinement::MeshHierarchy::NumLevels((MeshHierarchy *)local_f8);
  local_115 = 0;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,(ulong)level);
  for (local_11c = 0; local_11c < level; local_11c = local_11c + 1) {
    lf::refinement::MeshHierarchy::getMesh((MeshHierarchy *)local_148,(size_type)local_f8);
    std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
              ((shared_ptr<lf::mesh::Mesh_const> *)&local_138,
               (shared_ptr<lf::mesh::Mesh> *)local_148);
    local_128._M_t.
    super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
    super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
         (tuple<lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
         L2ErrorLinearFEDirichletLaplacian<std::function<double(Eigen::Matrix<double,2,1,0,2,1>const&)>&,lf::mesh::utils::MeshFunctionGlobal<std::function<double(Eigen::Matrix<double,2,1,0,2,1>const&)>>&>
                   (&local_138,u,
                    (MeshFunctionGlobal<std::function<double_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>_>
                     *)mesh_factory_ptr._M_t.
                       super___uniq_ptr_impl<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                       .super__Head_base<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_false>._M_head_impl
                   );
    std::vector<double,_std::allocator<double>_>::push_back
              (__return_storage_ptr__,(value_type_conflict1 *)&local_128);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_138);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)local_148);
  }
  local_115 = 1;
  lf::refinement::MeshHierarchy::~MeshHierarchy((MeshHierarchy *)local_f8);
  std::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ::~unique_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> SolveDirLaplSeqMesh(
    const std::shared_ptr<lf::mesh::Mesh> &coarse_mesh_p,
    unsigned int reflevels, SOLFUNCTOR &&u, RHSFUNCTOR &&f) {
  // Prepare for creating a hierarchy of meshes
  std::unique_ptr<lf::mesh::hybrid2d::MeshFactory> mesh_factory_ptr =
      std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
  lf::refinement::MeshHierarchy multi_mesh(coarse_mesh_p,
                                           std::move(mesh_factory_ptr));

  // Perform several steps of regular refinement of the given mesh
  for (unsigned int refstep = 0; refstep < reflevels; ++refstep) {
    // Barycentric refinement is the other option
    multi_mesh.RefineRegular(/*lf::refinement::RefPat::rp_barycentric*/);
  }
  // Solve Dirichlet boundary value problem on every level
  const lf::assemble::size_type L = multi_mesh.NumLevels();
  std::vector<double> errors;
  errors.reserve(L);
  for (unsigned level = 0; level < L; level++) {
    // Register norm of errors
    errors.push_back(
        L2ErrorLinearFEDirichletLaplacian(multi_mesh.getMesh(level), u, f));
  }
  return errors;
}